

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quass.cpp
# Opt level: O1

void __thiscall Quass::solve(Quass *this,QpVector *x0,QpVector *ra,Basis *b0,HighsTimer *timer)

{
  HighsInt *pHVar1;
  double *pdVar2;
  Matrix *this_00;
  PricingStrategy PVar3;
  int iVar4;
  uint uVar5;
  pointer piVar6;
  pointer piVar7;
  bool bVar8;
  uint uVar9;
  bool bVar10;
  Basis *this_01;
  int iVar11;
  QpSolverStatus QVar12;
  QpModelStatus QVar13;
  rep_conflict rVar14;
  ulong uVar15;
  QpVector *pQVar16;
  int *piVar17;
  QpVector *pQVar18;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> _Var19;
  Runtime *pRVar20;
  mapped_type *pmVar21;
  size_t __nbytes;
  int *piVar22;
  void *__buf;
  pointer extraout_RDX;
  pointer pdVar23;
  pointer extraout_RDX_00;
  pointer extraout_RDX_01;
  pointer extraout_RDX_02;
  pointer extraout_RDX_03;
  pointer extraout_RDX_04;
  pointer extraout_RDX_05;
  pointer extraout_RDX_06;
  pointer extraout_RDX_07;
  HighsInt HVar24;
  ulong uVar25;
  QpVector *pQVar26;
  long lVar27;
  long lVar28;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar29;
  double dVar30;
  QpVector p;
  QpVector buffer_yp;
  QpVector buffer_d;
  Gradient gradient;
  RatiotestResult stepres;
  ReducedGradient redgrad;
  QpVector buffer_m;
  QpVector rowmove;
  ReducedCosts redcosts;
  CholeskyFactor factor;
  QpVector buffer_Qp;
  QpVector buffer_gyp;
  QpVector yyp;
  uint local_5cc;
  SteepestEdgePricing *local_5c8;
  int local_5bc;
  double local_5b8;
  undefined8 uStack_5b0;
  HighsTimer *local_5a8;
  uint local_59c;
  QpVector local_598;
  double local_560;
  QpVector local_558;
  QpVector local_520;
  double local_4e8;
  undefined8 uStack_4e0;
  Gradient local_4d8;
  undefined1 local_490 [12];
  bool bStack_484;
  pointer local_470;
  ReducedGradient local_458;
  QpVector local_408;
  QpVector local_3d0;
  QpVector local_398;
  ReducedCosts local_360;
  CholeskyFactor local_310;
  double local_2b8;
  undefined8 uStack_2b0;
  QpVector local_2a0;
  QpVector local_268;
  undefined1 local_230 [8];
  vector<int,_std::allocator<int>_> local_228;
  vector<double,_std::allocator<double>_> local_210 [20];
  
  rVar14 = std::chrono::_V2::system_clock::now();
  pRVar20 = this->runtime;
  (pRVar20->statistics->time_start).__d.__r = rVar14;
  HVar24 = x0->dim;
  (pRVar20->primal).num_nz = x0->num_nz;
  (pRVar20->primal).dim = HVar24;
  std::vector<int,_std::allocator<int>_>::operator=(&(pRVar20->primal).index,&x0->index);
  std::vector<double,_std::allocator<double>_>::operator=(&(pRVar20->primal).value,&x0->value);
  local_4d8.runtime = this->runtime;
  QpVector::QpVector(&local_4d8.gradient,((local_4d8.runtime)->instance).num_var);
  local_4d8.uptodate = false;
  local_4d8.numupdates = 0;
  local_360.basis = b0;
  local_360.gradient = &local_4d8;
  QpVector::QpVector(&local_360.reducedcosts,(this->runtime->instance).num_var);
  local_360.uptodate = false;
  QpVector::QpVector(&local_458.rg,(this->runtime->instance).num_var);
  local_458.uptodate = false;
  local_458.gradient = &local_4d8;
  local_458.basis = b0;
  CholeskyFactor::CholeskyFactor(&local_310,this->runtime,b0);
  pRVar20 = this->runtime;
  MatrixBase::mat_vec_seq(&(pRVar20->instance).A.mat,&pRVar20->primal,&pRVar20->rowactivity);
  pRVar20 = this->runtime;
  PVar3 = (pRVar20->settings).pricing;
  if (PVar3 == Devex) {
    local_5c8 = (SteepestEdgePricing *)operator_new(0x38);
    (local_5c8->super_Pricing)._vptr_Pricing = (_func_int **)&PTR_price_00449210;
    local_5c8->runtime = pRVar20;
    local_5c8->basis = b0;
    local_5c8->redcosts = &local_360;
    local_230 = (undefined1  [8])0x3ff0000000000000;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_5c8->weights,(long)(pRVar20->instance).num_var,
               (value_type_conflict1 *)local_230,(allocator_type *)local_490);
  }
  else if (PVar3 == DantzigWolfe) {
    local_5c8 = (SteepestEdgePricing *)operator_new(0x20);
    (local_5c8->super_Pricing)._vptr_Pricing = (_func_int **)&PTR_price_00449260;
    local_5c8->runtime = pRVar20;
    local_5c8->basis = b0;
    local_5c8->redcosts = &local_360;
  }
  else if (PVar3 == SteepestEdge) {
    local_5c8 = (SteepestEdgePricing *)operator_new(0x38);
    SteepestEdgePricing::SteepestEdgePricing(local_5c8,pRVar20,b0,&local_360);
  }
  else {
    local_5c8 = (SteepestEdgePricing *)0x0;
  }
  QpVector::QpVector(&local_598,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_398,(this->runtime->instance).num_con);
  QpVector::QpVector(&local_558,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_268,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_408,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_3d0,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_2a0,(this->runtime->instance).num_var);
  QpVector::QpVector(&local_520,(this->runtime->instance).num_var);
  pRVar20 = this->runtime;
  if (((pRVar20->settings).hessianregularization == true) &&
     (uVar15 = (ulong)(pRVar20->instance).num_var, 0 < (long)uVar15)) {
    piVar6 = (pRVar20->instance).Q.mat.start.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (pRVar20->instance).Q.mat.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar25 = 0;
    do {
      iVar11 = piVar6[uVar25];
      lVar27 = (long)iVar11;
      iVar4 = piVar6[uVar25 + 1];
      if (iVar11 < iVar4) {
        pdVar23 = (pRVar20->instance).Q.mat.value.
                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start;
        do {
          if (uVar25 == (uint)piVar7[lVar27]) {
            pdVar23[lVar27] = (pRVar20->settings).hessianregularizationfactor + pdVar23[lVar27];
          }
          lVar27 = lVar27 + 1;
        } while (iVar4 != lVar27);
      }
      uVar25 = uVar25 + 1;
    } while (uVar25 != uVar15);
  }
  ratiotest_relax_instance((Instance *)local_230,pRVar20);
  Instance::operator=(&this->runtime->relaxed_for_ratiotest,(Instance *)local_230);
  Instance::~Instance((Instance *)local_230);
  pRVar20 = this->runtime;
  local_59c = pRVar20->statistics->num_iterations - 1;
  pdVar23 = (pointer)(ulong)local_59c;
  __nbytes = (ulong)((long)(b0->active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish -
                    (long)(b0->active_constraint_index).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start) >> 2;
  local_5cc = (uint)CONCAT71((int7)((ulong)pRVar20 >> 8),
                             (pRVar20->instance).num_var == (int)__nbytes);
  local_4e8 = 10.0;
  uStack_4e0 = 0;
  local_560 = 0.0;
  local_5a8 = timer;
  do {
    pRVar20 = this->runtime;
    if ((pRVar20->settings).iteration_limit <= pRVar20->statistics->num_iterations) {
      QVar13 = kIterationLimit;
LAB_0033b9d0:
      pRVar20->status = QVar13;
      goto LAB_0033b9d6;
    }
    HighsTimer::read(timer,0,pdVar23,__nbytes);
    pRVar20 = this->runtime;
    if ((pRVar20->settings).time_limit <= extraout_XMM0_Qa) {
      QVar13 = kTimeLimit;
      goto LAB_0033b9d0;
    }
    if ((pRVar20->settings).nullspace_limit <
        (int)((ulong)((long)(b0->non_active_constraint_index).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(b0->non_active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2)) {
      Eventhandler<int_&>::fire
                (&(pRVar20->settings).nullspace_limit_log,&(pRVar20->settings).nullspace_limit);
      this->runtime->status = kLargeNullspace;
      goto LAB_0033bc38;
    }
    HighsTimer::read(timer,0,__buf,__nbytes);
    pRVar20 = this->runtime;
    uVar5 = pRVar20->statistics->num_iterations;
    iVar11 = (pRVar20->settings).reportingfequency;
    if ((local_4e8 < extraout_XMM0_Qa_00 - local_560 || (int)uVar5 % iVar11 == 0) &&
       ((int)local_59c < (int)uVar5)) {
      uVar9 = iVar11 * 10;
      if (uVar5 != uVar9 && SBORROW4(uVar5,uVar9) == (int)(uVar5 + iVar11 * -10) < 0) {
        (pRVar20->settings).reportingfequency = uVar9;
      }
      uVar15 = -(ulong)(local_4e8 * 10.0 < extraout_XMM0_Qa_00);
      local_4e8 = (double)(~uVar15 & (ulong)local_4e8 | (ulong)(local_4e8 + local_4e8) & uVar15);
      local_5b8 = extraout_XMM0_Qa_00;
      if (uVar5 == uVar9 || SBORROW4(uVar5,uVar9) != (int)(uVar5 + iVar11 * -10) < 0) {
        loginformation(pRVar20,b0,&local_310,timer);
        Eventhandler<Statistics_&>::fire
                  (&(this->runtime->settings).iteration_log,this->runtime->statistics);
        local_560 = local_5b8;
        local_59c = uVar5;
      }
    }
    if (b0->reinversion_hint == true) {
      Basis::rebuild(b0);
      CholeskyFactor::recompute(&local_310);
      MatrixBase::vec_mat_1
                (&((local_4d8.runtime)->instance).Q.mat,&(local_4d8.runtime)->primal,
                 &local_4d8.gradient);
      QpVector::operator+=(&local_4d8.gradient,&((local_4d8.runtime)->instance).c);
      this_01 = local_360.basis;
      local_4d8.uptodate = true;
      local_4d8.numupdates = 0;
      pQVar16 = Gradient::getGradient(local_360.gradient);
      Basis::ftran(this_01,pQVar16,&local_360.reducedcosts,false,-1);
      local_360.uptodate = true;
      ReducedGradient::recompute(&local_458);
    }
    if ((local_5cc & 1) == 0) {
      if (local_458.uptodate == false) {
        ReducedGradient::recompute(&local_458);
      }
      QpVector::operator-((QpVector *)local_230,&local_458.rg);
      if ((int)local_230._0_4_ < 1) {
        iVar11 = 0;
      }
      else {
        lVar27 = 0;
        iVar11 = 0;
        do {
          iVar4 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar27];
          if (ABS(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4]) <= 1e-14) {
            local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4] = 0.0;
            local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar27] = 0;
          }
          else {
            lVar28 = (long)iVar11;
            iVar11 = iVar11 + 1;
            local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar28] = iVar4;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < (int)local_230._0_4_);
      }
      local_230._0_4_ = iVar11;
      CholeskyFactor::solve(&local_310,(QpVector *)local_230);
      if ((int)local_230._0_4_ < 1) {
        iVar11 = 0;
      }
      else {
        lVar27 = 0;
        iVar11 = 0;
        do {
          iVar4 = local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar27];
          if (ABS(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar4]) <= 1e-14) {
            local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[iVar4] = 0.0;
            local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar27] = 0;
          }
          else {
            lVar28 = (long)iVar11;
            iVar11 = iVar11 + 1;
            local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start[lVar28] = iVar4;
          }
          lVar27 = lVar27 + 1;
        } while (lVar27 < (int)local_230._0_4_);
      }
      local_230._0_4_ = iVar11;
      Basis::Zprod(b0,(QpVector *)local_230,&local_598);
      if (local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      MatrixBase::mat_vec_seq(&(this->runtime->instance).A.mat,&local_598,&local_398);
      pRVar20 = this->runtime;
      piVar17 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar22 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if (piVar17 != piVar22) {
        iVar11 = (pRVar20->instance).num_con;
        do {
          pdVar23 = local_598.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
          iVar4 = iVar11;
          if (*piVar17 < iVar11) {
            pdVar23 = local_398.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar4 = 0;
          }
          pdVar23[(uint)(*piVar17 - iVar4)] = 0.0;
          piVar17 = piVar17 + 1;
        } while (piVar17 != piVar22);
      }
      MatrixBase::mat_vec_seq(&(pRVar20->instance).Q.mat,&local_598,&local_2a0);
      bVar10 = false;
      local_5b8 = 1.0;
      uStack_5b0 = 0;
      pdVar23 = extraout_RDX;
LAB_0033b550:
      if ((long)local_598.num_nz < 1) {
        dVar30 = 0.0;
      }
      else {
        dVar30 = 0.0;
        lVar27 = 0;
        do {
          dVar30 = dVar30 + local_598.value.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start
                            [local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar27]] *
                            local_598.value.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start
                            [local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_start[lVar27]];
          lVar27 = lVar27 + 1;
          piVar22 = local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          pdVar23 = local_598.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start;
        } while (local_598.num_nz != lVar27);
      }
      __nbytes = CONCAT71((int7)((ulong)piVar22 >> 8),1);
      if (((local_5b8 != 0.0) || (iVar11 = 0, NAN(local_5b8))) &&
         (pRVar20 = this->runtime, iVar11 = 0, (pRVar20->settings).pnorm_zero_threshold <= dVar30))
      {
        pHVar1 = &pRVar20->statistics->num_iterations;
        *pHVar1 = *pHVar1 + 1;
        _local_490 = ratiotest(pRVar20,&local_598,&local_398,local_5b8);
        if (local_490._8_4_ == -1) {
          if (INFINITY <= local_490._0_8_) {
            this->runtime->status = kUnbounded;
            iVar11 = 1;
            pdVar23 = extraout_RDX_01;
            goto LAB_0033b97a;
          }
          if (local_458.uptodate == true) {
            local_458.uptodate = false;
          }
          local_5cc = 0;
        }
        else {
          pRVar20 = this->runtime;
          local_5bc = local_490._8_4_;
          _Var19 = std::
                   __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                             ((b0->non_active_constraint_index).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (b0->non_active_constraint_index).
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish,&local_5bc);
          if ((_Var19._M_current ==
               (b0->non_active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_finish) ||
             (HVar24 = (HighsInt)
                       ((ulong)((long)_Var19._M_current -
                               (long)(b0->non_active_constraint_index).
                                     super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_start) >> 2), HVar24 == -1)) {
            this_00 = &(pRVar20->instance).A;
            if ((pRVar20->instance).A.has_transpose == false) {
              Matrix::transpose(this_00);
              (pRVar20->instance).A.has_transpose = true;
            }
            MatrixBase::extractcol((QpVector *)local_230,&this_00->tran,local_5bc);
            Basis::Ztprod(b0,(QpVector *)local_230,&local_520,true,local_5bc);
            if ((long)local_520.num_nz < 1) {
              HVar24 = 0;
              pdVar23 = extraout_RDX_02;
            }
            else {
              HVar24 = 0;
              lVar27 = 0;
              do {
                iVar11 = local_520.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar27];
                if (ABS(local_520.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [local_520.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[lVar27]]) <=
                    ABS(local_520.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[HVar24])) {
                  iVar11 = HVar24;
                }
                HVar24 = iVar11;
                lVar27 = lVar27 + 1;
                pdVar23 = local_520.value.super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              } while (local_520.num_nz != lVar27);
            }
            local_5b8 = (double)CONCAT44(local_5b8._4_4_,
                                         (b0->non_active_constraint_index).
                                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                         super__Vector_impl_data._M_start[HVar24]);
            dVar29 = ABS(local_520.value.super__Vector_base<double,_std::allocator<double>_>._M_impl
                         .super__Vector_impl_data._M_start[HVar24]);
            dVar30 = (pRVar20->settings).d_zero_threshold;
            bVar8 = dVar30 <= dVar29;
            if (dVar29 < dVar30) {
              log10(dVar29);
              printf(
                    "degeneracy? not possible to find non-active constraint to leave basis. max: log(d[%d]) = %lf\n"
                    );
              pdVar23 = extraout_RDX_03;
            }
            if (local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_210[0].super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
              pdVar23 = extraout_RDX_04;
            }
            if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start != (pointer)0x0) {
              operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
              pdVar23 = extraout_RDX_05;
            }
          }
          else {
            local_5b8 = (double)CONCAT44(local_5b8._4_4_,local_5bc);
            if (0 < local_520.num_nz) {
              lVar27 = 0;
              do {
                local_520.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start
                [local_520.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar27]] = 0.0;
                local_520.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar27] = 0;
                lVar27 = lVar27 + 1;
              } while (lVar27 < local_520.num_nz);
            }
            *local_520.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start = HVar24;
            pdVar23 = (pointer)0x3ff0000000000000;
            local_520.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start[HVar24] = 1.0;
            local_520.num_nz = 1;
            bVar8 = true;
          }
          if (bVar8) {
            if (!bVar10) {
              _Var19 = std::
                       __find_if<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,__gnu_cxx::__ops::_Iter_equals_val<int_const>>
                                 ((b0->non_active_constraint_index).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start,
                                  (b0->non_active_constraint_index).
                                  super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_finish,local_490 + 8);
              CholeskyFactor::reduce
                        (&local_310,&local_520,HVar24,
                         (int)((ulong)~((long)_Var19._M_current -
                                       (long)(b0->non_active_constraint_index).
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data._M_start) >> 2) != 0 &&
                         _Var19._M_current !=
                         (b0->non_active_constraint_index).
                         super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish);
            }
            ReducedGradient::reduce(&local_458,&local_520,HVar24);
            if (local_458.uptodate == true) {
              local_458.uptodate = false;
            }
            QVar12 = Basis::activate(b0,&this->runtime->settings,local_490._8_4_,
                                     kActiveAtUpper - bStack_484,local_5b8._0_4_,
                                     &local_5c8->super_Pricing);
            pdVar23 = extraout_RDX_06;
            if (QVar12 != OK) goto LAB_0033b8ef;
            local_5cc = local_5cc & 0xff;
            if ((this->runtime->instance).num_var !=
                (int)((ulong)((long)(b0->active_constraint_index).
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish -
                             (long)(b0->active_constraint_index).
                                   super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start) >> 2)) {
              local_5cc = 0;
            }
            bVar10 = true;
          }
          else {
LAB_0033b8ef:
            this->runtime->status = kUndetermined;
            bVar10 = false;
          }
          iVar11 = 1;
          timer = local_5a8;
          if (!bVar10) goto LAB_0033b97a;
        }
        QpVector::saxpy(&this->runtime->primal,(double)local_490._0_8_,&local_598);
        QpVector::saxpy(&this->runtime->rowactivity,(double)local_490._0_8_,&local_398);
        QpVector::saxpy(&local_4d8.gradient,(double)local_490._0_8_,&local_2a0);
        local_4d8.numupdates = local_4d8.numupdates + 1;
        local_360.uptodate = false;
        iVar11 = 0;
        pdVar23 = extraout_RDX_07;
        goto LAB_0033b97a;
      }
    }
    else {
      pRVar20 = this->runtime;
      pQVar16 = Gradient::getGradient(&local_4d8);
      iVar11 = (**(local_5c8->super_Pricing)._vptr_Pricing)(local_5c8,&pRVar20->primal,pQVar16);
      pRVar20 = this->runtime;
      if (iVar11 == -1) {
        bVar10 = false;
        iVar11 = 3;
        pdVar23 = (pointer)0x2;
        local_5b8 = 1.0;
        uStack_5b0 = 0;
LAB_0033b520:
        pRVar20->status = (QpModelStatus)pdVar23;
        piVar22 = (int *)0x0;
      }
      else {
        pHVar1 = &pRVar20->statistics->num_iterations;
        *pHVar1 = *pHVar1 + 1;
        iVar4 = (b0->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
                _M_impl.super__Vector_impl_data._M_start[iVar11];
        if (0 < local_558.num_nz) {
          lVar27 = 0;
          do {
            local_558.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start
            [local_558.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start[lVar27]] = 0.0;
            local_558.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_start[lVar27] = 0;
            lVar27 = lVar27 + 1;
          } while (lVar27 < local_558.num_nz);
        }
        *local_558.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_start = iVar4;
        local_558.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[iVar4] = 1.0;
        local_558.num_nz = 1;
        Basis::btran(b0,&local_558,&local_558,true,iVar11);
        local_3d0.dim =
             (HighsInt)
             ((ulong)((long)(b0->non_active_constraint_index).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(b0->non_active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2);
        local_408.dim = local_3d0.dim;
        pRVar20 = this->runtime;
        QpVector::QpVector((QpVector *)local_230,&local_558);
        MatrixBase::mat_vec_seq(&(pRVar20->instance).Q.mat,(QpVector *)local_230,&local_268);
        if ((int)((ulong)((long)(b0->active_constraint_index).
                                super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(b0->active_constraint_index).
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 2) < (pRVar20->instance).num_var
           ) {
          Basis::Ztprod(b0,&local_268,&local_3d0,false,-1);
          local_408.dim = local_3d0.dim;
          local_408.num_nz = local_3d0.num_nz;
          std::vector<int,_std::allocator<int>_>::operator=(&local_408.index,&local_3d0.index);
          std::vector<double,_std::allocator<double>_>::operator=(&local_408.value,&local_3d0.value)
          ;
          CholeskyFactor::solveL(&local_310,&local_408);
          QpVector::QpVector((QpVector *)local_490,&local_408);
          CholeskyFactor::solveLT(&local_310,(QpVector *)local_490);
          Basis::Zprod(b0,(QpVector *)local_490,&local_598);
          pQVar16 = Gradient::getGradient(&local_4d8);
          dVar30 = -1.0;
          if (0 < (long)pQVar16->num_nz) {
            dVar29 = 0.0;
            lVar27 = 0;
            do {
              iVar4 = (pQVar16->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar27];
              dVar29 = dVar29 + (pQVar16->value).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar4] *
                                local_210[0].super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar4];
              lVar27 = lVar27 + 1;
            } while (pQVar16->num_nz != lVar27);
            dVar30 = -1.0;
            if (dVar29 < 0.0) {
              dVar30 = 1.0;
            }
          }
          QpVector::saxpy(&local_598,-1.0,dVar30,(QpVector *)local_230);
          if (local_470 != (pointer)0x0) {
            operator_delete(local_470);
          }
          if (stack0xfffffffffffffb78 != (pointer)0x0) {
            operator_delete(stack0xfffffffffffffb78);
          }
        }
        else {
          if (0 < local_598.num_nz) {
            lVar27 = 0;
            do {
              local_598.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar27]] = 0.0;
              local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar27] = 0;
              lVar27 = lVar27 + 1;
            } while (lVar27 < local_598.num_nz);
          }
          if (0 < local_558.num_nz) {
            lVar27 = 0;
            do {
              iVar4 = local_558.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar27];
              local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar27] = iVar4;
              local_598.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[iVar4] =
                   local_558.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[iVar4];
              lVar27 = lVar27 + 1;
            } while (lVar27 < local_558.num_nz);
          }
          local_598.num_nz = local_558.num_nz;
          pQVar16 = Gradient::getGradient(&local_4d8);
          if ((long)pQVar16->num_nz < 1) {
            dVar30 = 0.0;
          }
          else {
            dVar30 = 0.0;
            lVar27 = 0;
            do {
              iVar4 = (pQVar16->index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[lVar27];
              dVar30 = dVar30 + (pQVar16->value).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start[iVar4] *
                                local_558.value.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start[iVar4];
              lVar27 = lVar27 + 1;
            } while (pQVar16->num_nz != lVar27);
          }
          if (0 < (long)local_598.num_nz) {
            lVar27 = 0;
            do {
              local_598.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start
              [local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start[lVar27]] =
                   local_598.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start
                   [local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar27]] * -dVar30;
              lVar27 = lVar27 + 1;
            } while (local_598.num_nz != lVar27);
          }
        }
        if (local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
        }
        Basis::deactivate(b0,iVar11);
        MatrixBase::mat_vec_seq(&(this->runtime->instance).A.mat,&local_598,&local_398);
        pRVar20 = this->runtime;
        piVar17 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        piVar22 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        if (piVar17 != piVar22) {
          iVar11 = (pRVar20->instance).num_con;
          do {
            pdVar23 = local_598.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar4 = iVar11;
            if (*piVar17 < iVar11) {
              pdVar23 = local_398.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar4 = 0;
            }
            pdVar23[(uint)(*piVar17 - iVar4)] = 0.0;
            piVar17 = piVar17 + 1;
          } while (piVar17 != piVar22);
        }
        pQVar18 = MatrixBase::mat_vec_seq(&(pRVar20->instance).Q.mat,&local_598,&local_2a0);
        pQVar16 = (QpVector *)(long)local_598.num_nz;
        if ((long)pQVar16 < 1) {
          local_2b8 = 0.0;
        }
        else {
          local_2b8 = 0.0;
          pQVar26 = (QpVector *)0x0;
          do {
            local_2b8 = local_2b8 +
                        local_598.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start
                        [local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pQVar26]] *
                        (pQVar18->value).super__Vector_base<double,_std::allocator<double>_>._M_impl
                        .super__Vector_impl_data._M_start
                        [local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[(long)pQVar26]];
            pQVar26 = (QpVector *)((long)&pQVar26->num_nz + 1);
          } while (pQVar16 != pQVar26);
        }
        uStack_2b0 = 0;
        bVar10 = true;
        pdVar2 = &(pRVar20->settings).pQp_zero_threshold;
        local_5b8 = INFINITY;
        uStack_5b0 = 0;
        if (*pdVar2 <= ABS(local_2b8) && ABS(local_2b8) != *pdVar2) {
          pQVar18 = Gradient::getGradient(&local_4d8);
          pQVar16 = (QpVector *)(long)local_598.num_nz;
          if ((long)pQVar16 < 1) {
            dVar30 = 0.0;
          }
          else {
            dVar30 = 0.0;
            pQVar26 = (QpVector *)0x0;
            do {
              dVar30 = dVar30 + local_598.value.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start
                                [local_598.index.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(long)pQVar26]] *
                                (pQVar18->value).super__Vector_base<double,_std::allocator<double>_>
                                ._M_impl.super__Vector_impl_data._M_start
                                [local_598.index.super__Vector_base<int,_std::allocator<int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[(long)pQVar26]];
              pQVar26 = (QpVector *)((long)&pQVar26->num_nz + 1);
            } while (pQVar16 != pQVar26);
          }
          local_5b8 = (double)(~-(ulong)(-dVar30 < dVar30) & (ulong)(-dVar30 / local_2b8));
          bVar10 = false;
        }
        uStack_5b0 = 0;
        if (!bVar10) {
          pQVar16 = &local_408;
          QVar12 = CholeskyFactor::expand(&local_310,&local_558,&local_268,pQVar16,&local_3d0);
          if (QVar12 != OK) {
            pRVar20 = this->runtime;
            pdVar23 = (pointer)&DAT_00000001;
            iVar11 = 1;
            timer = local_5a8;
            goto LAB_0033b520;
          }
        }
        ReducedGradient::expand(&local_458,&local_558);
        iVar11 = 0;
        piVar22 = (int *)CONCAT71((int7)((ulong)pQVar16 >> 8),1);
        pdVar23 = extraout_RDX_00;
        timer = local_5a8;
      }
      if ((char)piVar22 != '\0') goto LAB_0033b550;
LAB_0033b97a:
      __nbytes = (size_t)local_5cc;
    }
    local_5cc = (uint)__nbytes;
  } while (iVar11 == 0);
  if (iVar11 == 3) {
LAB_0033b9d6:
    loginformation(this->runtime,b0,&local_310,timer);
    Eventhandler<Statistics_&>::fire
              (&(this->runtime->settings).iteration_log,this->runtime->statistics);
    pRVar20 = this->runtime;
    MatrixBase::mat_vec((QpVector *)local_230,&(pRVar20->instance).A.mat,&pRVar20->primal);
    Instance::sumnumprimalinfeasibilities(&pRVar20->instance,&pRVar20->primal,(QpVector *)local_230)
    ;
    if (local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    pQVar16 = ReducedCosts::getReducedCosts(&local_360);
    piVar17 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start;
    piVar22 = (b0->active_constraint_index).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (piVar17 != piVar22) {
      piVar6 = (b0->constraintindexinbasisfactor).super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pRVar20 = this->runtime;
      iVar11 = (pRVar20->instance).num_con;
      pdVar23 = (pQVar16->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start;
      do {
        iVar4 = *piVar17;
        lVar27 = (long)(iVar4 - iVar11);
        if (iVar4 < iVar11) {
          lVar27 = (long)iVar4;
        }
        pQVar16 = &pRVar20->dualvar;
        if (iVar4 < iVar11) {
          pQVar16 = &pRVar20->dualcon;
        }
        (pQVar16->value).super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = pdVar23[piVar6[iVar4]];
        piVar17 = piVar17 + 1;
      } while (piVar17 != piVar22);
    }
    QpVector::resparsify(&this->runtime->dualcon);
    QpVector::resparsify(&this->runtime->dualvar);
    pRVar20 = this->runtime;
    if (0 < (pRVar20->instance).num_var) {
      lVar27 = 0;
      do {
        local_230._0_4_ = (pRVar20->instance).num_con + (int)lVar27;
        pmVar21 = std::
                  map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
                  ::operator[](&b0->basisstatus,(key_type_conflict1 *)local_230);
        pRVar20 = this->runtime;
        (pRVar20->status_var).super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = *pmVar21;
        lVar27 = lVar27 + 1;
      } while (lVar27 < (pRVar20->instance).num_var);
    }
    pRVar20 = this->runtime;
    if (0 < (pRVar20->instance).num_con) {
      lVar27 = 0;
      do {
        local_230._0_4_ = (int)lVar27;
        pmVar21 = std::
                  map<int,_BasisStatus,_std::less<int>,_std::allocator<std::pair<const_int,_BasisStatus>_>_>
                  ::operator[](&b0->basisstatus,(key_type_conflict1 *)local_230);
        pRVar20 = this->runtime;
        (pRVar20->status_con).super__Vector_base<BasisStatus,_std::allocator<BasisStatus>_>._M_impl.
        super__Vector_impl_data._M_start[lVar27] = *pmVar21;
        lVar27 = lVar27 + 1;
      } while (lVar27 < (pRVar20->instance).num_con);
    }
    if ((pRVar20->instance).num_var ==
        (int)((ulong)((long)(b0->active_constraint_index).
                            super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                     (long)(b0->active_constraint_index).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start) >> 2)) {
      Basis::recomputex((QpVector *)local_230,b0,&pRVar20->instance);
      pRVar20 = this->runtime;
      (pRVar20->primal).num_nz = local_230._0_4_;
      (pRVar20->primal).dim = local_230._4_4_;
      std::vector<int,_std::allocator<int>_>::operator=(&(pRVar20->primal).index,&local_228);
      std::vector<double,_std::allocator<double>_>::operator=(&(pRVar20->primal).value,local_210);
      if (local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_210[0].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_228.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    rVar14 = std::chrono::_V2::system_clock::now();
    (this->runtime->statistics->time_end).__d.__r = rVar14;
  }
LAB_0033bc38:
  if (local_520.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_520.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_520.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_520.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2a0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2a0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_2a0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3d0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_3d0.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_3d0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_3d0.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_408.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_408.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_408.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_408.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_268.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_268.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_268.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_268.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_558.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_558.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_558.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_558.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_398.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_398.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_398.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_398.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_598.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_598.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_598.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_5c8 != (SteepestEdgePricing *)0x0) {
    (*(local_5c8->super_Pricing)._vptr_Pricing[4])();
  }
  if (local_310.a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.a.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_310.L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_310.L.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_458.rg.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_458.rg.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_458.rg.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_458.rg.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_360.reducedcosts.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_360.reducedcosts.value.super__Vector_base<double,_std::allocator<double>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_360.reducedcosts.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_360.reducedcosts.index.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4d8.gradient.value.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d8.gradient.value.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  if (local_4d8.gradient.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_4d8.gradient.index.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void Quass::solve(const QpVector& x0, const QpVector& ra, Basis& b0,
                  HighsTimer& timer) {
  // feenableexcept(FE_ALL_EXCEPT & ~FE_INEXACT & ~FE_UNDERFLOW);

  runtime.statistics.time_start = std::chrono::high_resolution_clock::now();
  Basis& basis = b0;
  runtime.primal = x0;

  // TODO: remove redundant equations before starting
  // HOWTO: from crash start, check all (near-)equality constraints (not
  // bounds). if the residual is 0 (or near-zero?), remove constraint

  Gradient gradient(runtime);
  ReducedCosts redcosts(runtime, basis, gradient);
  ReducedGradient redgrad(runtime, basis, gradient);
  CholeskyFactor factor(runtime, basis);
  runtime.instance.A.mat_vec(runtime.primal, runtime.rowactivity);
  std::unique_ptr<Pricing> pricing = getPricing(runtime, basis, redcosts);

  QpVector p(runtime.instance.num_var);
  QpVector rowmove(runtime.instance.num_con);

  QpVector buffer_yp(runtime.instance.num_var);
  QpVector buffer_gyp(runtime.instance.num_var);
  QpVector buffer_l(runtime.instance.num_var);
  QpVector buffer_m(runtime.instance.num_var);

  QpVector buffer_Qp(runtime.instance.num_var);

  // buffers for reduction
  QpVector buffer_d(runtime.instance.num_var);

  regularize(runtime);

  runtime.relaxed_for_ratiotest = ratiotest_relax_instance(runtime);

  HighsInt last_logging_iteration = runtime.statistics.num_iterations - 1;
  double last_logging_time = 0;
  double logging_time_interval = 10;

  const HighsInt current_num_active = basis.getnumactive();
  bool atfsep = current_num_active == runtime.instance.num_var;
  while (true) {
    // check iteration limit
    if (runtime.statistics.num_iterations >= runtime.settings.iteration_limit) {
      runtime.status = QpModelStatus::kIterationLimit;
      break;
    }

    // check time limit
    if (timer.read() >= runtime.settings.time_limit) {
      runtime.status = QpModelStatus::kTimeLimit;
      break;
    }

    if (basis.getnuminactive() > runtime.settings.nullspace_limit) {
      runtime.settings.nullspace_limit_log.fire(
          runtime.settings.nullspace_limit);
      runtime.status = QpModelStatus::kLargeNullspace;
      return;
    }

    // LOGGING
    double run_time = timer.read();
    if ((runtime.statistics.num_iterations %
                 runtime.settings.reportingfequency ==
             0 ||
         run_time - last_logging_time > logging_time_interval) &&
        runtime.statistics.num_iterations > last_logging_iteration) {
      bool log_report = true;
      if (runtime.statistics.num_iterations >
          10 * runtime.settings.reportingfequency) {
        runtime.settings.reportingfequency *= 10;
        log_report = false;
      }
      if (run_time > 10 * logging_time_interval) logging_time_interval *= 2.0;
      if (log_report) {
        last_logging_time = run_time;
        last_logging_iteration = runtime.statistics.num_iterations;
        loginformation(runtime, basis, factor, timer);
        runtime.settings.iteration_log.fire(runtime.statistics);
      }
    }

    // REINVERSION
    if (check_reinvert_due(basis)) {
      reinvert(basis, factor, gradient, redcosts, redgrad, pricing);
    }

    QpSolverStatus status;

    bool zero_curvature_direction = false;
    double maxsteplength = 1.0;
    if (atfsep) {
      // Determine a variable to relax from being active. If there is
      // none, then basis is optimal
      HighsInt minidx = pricing->price(runtime.primal, gradient.getGradient());
      if (minidx == -1) {
        runtime.status = QpModelStatus::kOptimal;
        break;
      }
      // Now perform a real iteration
      runtime.statistics.num_iterations++;

      HighsInt unit = basis.getindexinfactor()[minidx];
      QpVector::unit(runtime.instance.num_var, unit, buffer_yp);
      basis.btran(buffer_yp, buffer_yp, true, minidx);

      buffer_l.dim = basis.getnuminactive();
      buffer_m.dim = basis.getnuminactive();
      computesearchdirection_major(runtime, basis, factor, buffer_yp, gradient,
                                   buffer_gyp, buffer_l, buffer_m, p);
      basis.deactivate(minidx);
      computerowmove(runtime, basis, p, rowmove);
      tidyup(p, rowmove, basis, runtime);
      maxsteplength = std::numeric_limits<double>::infinity();
      // if (runtime.instance.Q.mat.value.size() > 0) {
      maxsteplength = computemaxsteplength(runtime, p, gradient, buffer_Qp,
                                           zero_curvature_direction);
      if (!zero_curvature_direction) {
        status = factor.expand(buffer_yp, buffer_gyp, buffer_l, buffer_m);
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
      }
      redgrad.expand(buffer_yp);
    } else {
      // Compute a search direction - which may be zero, in which case
      // atfsep is set true and the loop repeats with this
      // condition. In particular, this happens when the current basis
      // is optimal
      computesearchdirection_minor(runtime, basis, factor, redgrad, p);
      computerowmove(runtime, basis, p, rowmove);
      tidyup(p, rowmove, basis, runtime);
      runtime.instance.Q.mat_vec(p, buffer_Qp);
    }
    if (p.norm2() < runtime.settings.pnorm_zero_threshold ||
        maxsteplength == 0.0 ||
        (false && fabs(gradient.getGradient().dot(p)) <
                      runtime.settings.improvement_zero_threshold)) {
      atfsep = true;
    } else {
      // Now perform a real iteration
      runtime.statistics.num_iterations++;

      RatiotestResult stepres = ratiotest(runtime, p, rowmove, maxsteplength);
      if (stepres.limitingconstraint != -1) {
        HighsInt constrainttodrop;
        HighsInt maxabsd;
        status = reduce(runtime, basis, stepres.limitingconstraint, buffer_d,
                        maxabsd, constrainttodrop);
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
        if (!zero_curvature_direction) {
          factor.reduce(
              buffer_d, maxabsd,
              indexof(basis.getinactive(), stepres.limitingconstraint) != -1);
        }
        redgrad.reduce(buffer_d, maxabsd);
        redgrad.update(stepres.alpha, false);

        status = basis.activate(runtime.settings, stepres.limitingconstraint,
                                stepres.nowactiveatlower
                                    ? BasisStatus::kActiveAtLower
                                    : BasisStatus::kActiveAtUpper,
                                constrainttodrop, pricing.get());
        if (status != QpSolverStatus::OK) {
          runtime.status = QpModelStatus::kUndetermined;
          return;
        }
        if (basis.getnumactive() != runtime.instance.num_var) {
          atfsep = false;
        }
      } else {
        if (stepres.alpha == std::numeric_limits<double>::infinity()) {
          // unbounded
          runtime.status = QpModelStatus::kUnbounded;
          return;
        }
        atfsep = false;
        redgrad.update(stepres.alpha, false);
      }

      runtime.primal.saxpy(stepres.alpha, p);
      runtime.rowactivity.saxpy(stepres.alpha, rowmove);

      gradient.update(buffer_Qp, stepres.alpha);
      redcosts.update();
    }
  }

  loginformation(runtime, basis, factor, timer);
  runtime.settings.iteration_log.fire(runtime.statistics);
  //  basis.report();

  runtime.instance.sumnumprimalinfeasibilities(
      runtime.primal, runtime.instance.A.mat_vec(runtime.primal));

  QpVector& lambda = redcosts.getReducedCosts();
  for (auto e : basis.getactive()) {
    HighsInt indexinbasis = basis.getindexinfactor()[e];
    if (e >= runtime.instance.num_con) {
      // active variable bound
      HighsInt var = e - runtime.instance.num_con;
      runtime.dualvar.value[var] = lambda.value[indexinbasis];
    } else {
      runtime.dualcon.value[e] = lambda.value[indexinbasis];
    }
  }
  runtime.dualcon.resparsify();
  runtime.dualvar.resparsify();

  // QpVector actual_dual_var(runtime.instance.num_var);
  // QpVector actual_dual_con(runtime.instance.num_con);
  // compute_actual_duals(runtime, basis, redcosts.getReducedCosts(),
  // actual_dual_con, actual_dual_var); printf("max primal violation =
  // %.20lf\n", compute_primal_violation(runtime)); printf("max dual   violation
  // = %.20lf\n", compute_dual_violation(runtime.instance, runtime.primal,
  // actual_dual_con, actual_dual_var));

  // extract basis status
  for (HighsInt i = 0; i < runtime.instance.num_var; i++) {
    runtime.status_var[i] = basis.getstatus(runtime.instance.num_con + i);
  }

  for (HighsInt i = 0; i < runtime.instance.num_con; i++) {
    runtime.status_con[i] = basis.getstatus(i);
  }

  if (basis.getnumactive() == runtime.instance.num_var) {
    runtime.primal = basis.recomputex(runtime.instance);
  }
  // x.report("x");
  runtime.statistics.time_end = std::chrono::high_resolution_clock::now();
}